

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

QTextLayoutStruct * __thiscall
QTextDocumentLayoutPrivate::layoutCell
          (QTextLayoutStruct *__return_storage_ptr__,QTextDocumentLayoutPrivate *this,QTextTable *t,
          QTextTableCell *cell,QFixed width,int layoutFrom,int layoutTo,QTextTableData *td,
          QFixed absoluteTableY,bool withPageBreaks)

{
  QTextFrame *pQVar1;
  double dVar2;
  qreal qVar3;
  uint uVar4;
  Iterator it;
  int *piVar5;
  QDebug this_00;
  char cVar6;
  QFixed QVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  QTextFrameLayoutData *pQVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  long in_FS_OFFSET;
  QByteArrayView QVar18;
  QSizeF QVar19;
  QDebug local_98;
  iterator local_90;
  QTextFormat local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcTable();
  if (((byte)lcTable::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58._0_4_ = 2;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    local_40 = lcTable::category.name;
    QMessageLogger::debug();
    this_00.stream = local_98.stream;
    QVar18.m_data = (storage_type *)0xa;
    QVar18.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<(&(this_00.stream)->ts,(QString *)&local_70);
    piVar5 = (int *)CONCAT44(local_70.d.d.ptr._4_4_,(int)local_70.d.d.ptr);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_70.d.d.ptr._4_4_,(int)local_70.d.d.ptr),2,0x10);
      }
    }
    if ((local_98.stream)->space == true) {
      QTextStream::operator<<(&(local_98.stream)->ts,' ');
    }
    QDebug::~QDebug(&local_98);
  }
  *(undefined1 **)&__return_storage_ptr__->maximumWidth = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->frame = (QTextFrame *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->x_left = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->frameY = 0;
  __return_storage_ptr__->y = 0;
  __return_storage_ptr__->contentsWidth = 0;
  __return_storage_ptr__->minimumWidth = 0;
  __return_storage_ptr__->fullLayout = false;
  (__return_storage_ptr__->pendingFloats).d.d = (Data *)0x0;
  (__return_storage_ptr__->pendingFloats).d.ptr = (QTextFrame **)0x0;
  (__return_storage_ptr__->pendingFloats).d.size = 0;
  __return_storage_ptr__->pageHeight = 0;
  __return_storage_ptr__->pageBottom = 0;
  __return_storage_ptr__->pageTopMargin = 0;
  __return_storage_ptr__->pageBottomMargin = 0;
  (__return_storage_ptr__->updateRect).xp = 0.0;
  (__return_storage_ptr__->updateRect).yp = 0.0;
  (__return_storage_ptr__->updateRect).w = 0.0;
  (__return_storage_ptr__->updateRect).h = 0.0;
  (__return_storage_ptr__->updateRectForFloats).xp = 0.0;
  (__return_storage_ptr__->updateRectForFloats).yp = 0.0;
  (__return_storage_ptr__->updateRectForFloats).w = 0.0;
  (__return_storage_ptr__->updateRectForFloats).h = 0.0;
  __return_storage_ptr__->frame = &t->super_QTextFrame;
  (__return_storage_ptr__->maximumWidth).val = 0x1fffffc0;
  QVar7 = QTextTableData::topPadding(td,t,cell);
  uVar14 = 0;
  if (withPageBreaks) {
    iVar8 = QTextTableCell::row(cell);
    uVar14 = QVar7.val + absoluteTableY.val + (td->rowPositions).d.ptr[iVar8].val;
    (__return_storage_ptr__->frameY).val = uVar14;
  }
  (__return_storage_ptr__->x_left).val = 0;
  (__return_storage_ptr__->x_right).val = width.val;
  QVar19 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
  uVar15 = (uint)(QVar19.ht * 64.0);
  (__return_storage_ptr__->pageHeight).val = uVar15;
  if ((int)uVar15 < 0 || !withPageBreaks) {
    (__return_storage_ptr__->pageHeight).val = 0x1fffffc0;
    uVar15 = 0x1fffffc0;
  }
  else if (uVar15 == 0) {
    uVar15 = 0;
    iVar8 = 0;
    goto LAB_004e7e9d;
  }
  uVar4 = -uVar14;
  if (0 < (int)uVar14) {
    uVar4 = uVar14;
  }
  iVar9 = (int)(((ulong)(uVar15 >> 1) + (ulong)uVar4 * 0x40) / (ulong)uVar15);
  iVar8 = -iVar9;
  if (-1 < (int)(uVar14 ^ uVar15)) {
    iVar8 = iVar9;
  }
  iVar8 = iVar8 >> 6;
LAB_004e7e9d:
  iVar9 = (td->super_QTextFrameData).effectiveTopMargin.val;
  iVar10 = (td->cellSpacing).val;
  iVar11 = (td->super_QTextFrameData).border.val;
  QTextTableCell::format((QTextTableCell *)&local_70);
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_4_ = 0xaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_4_ = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  QTextFormat::property((QVariant *)&local_58,&local_70,0x4812);
  cVar6 = ::QVariant::isNull();
  if (cVar6 == '\0') {
    dVar2 = (double)::QVariant::toReal((bool *)local_58.data);
    iVar17 = (int)(dVar2 * td->deviceScale * 64.0);
  }
  else {
    iVar17 = (td->cellPadding).val;
  }
  iVar17 = iVar9 + iVar10 + iVar11 + iVar17;
  ::QVariant::~QVariant((QVariant *)&local_58);
  (__return_storage_ptr__->pageTopMargin).val = iVar17;
  QTextFormat::~QTextFormat(&local_70);
  QTextTable::format((QTextTable *)&local_58);
  iVar9 = QTextFormat::intProperty((QTextFormat *)&local_58,0x4104);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  if ((0 < iVar9) && (td->borderCollapse != false)) {
    QTextTableCell::column(cell);
    QTextTable::cellAt((QTextTable *)&local_70,(int)t,iVar9 + -1);
    axisEdgeData((EdgeData *)&local_58,t,td,(QTextTableCell *)&local_70,BottomEdge);
    qVar3 = scaleToDevice(this,(qreal)CONCAT44(local_58._4_4_,local_58._0_4_));
    iVar17 = iVar17 + (int)(qVar3 * 0.5 * 64.0);
    (__return_storage_ptr__->pageTopMargin).val = iVar17;
  }
  iVar9 = (td->super_QTextFrameData).effectiveBottomMargin.val;
  iVar10 = (td->cellSpacing).val;
  iVar11 = (td->effectiveBottomBorder).val;
  QVar7 = QTextTableData::bottomPadding(td,t,cell);
  iVar9 = QVar7.val + iVar9 + iVar10 + iVar11;
  (__return_storage_ptr__->pageBottomMargin).val = iVar9;
  (__return_storage_ptr__->pageBottom).val = (iVar8 + 1) * uVar15 - iVar9;
  __return_storage_ptr__->fullLayout = true;
  iVar9 = (uVar15 * iVar8 + iVar17) - uVar14;
  iVar8 = 0;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  (__return_storage_ptr__->y).val = iVar9;
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_4_ = 0xaaaaaaaa;
  local_58._0_4_ = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  iVar9 = QTextTableCell::row(cell);
  iVar10 = QTextTableCell::column(cell);
  iVar11 = QTextTable::rows(t);
  local_70.d.d.ptr._0_4_ = iVar11 * iVar10 + iVar9;
  QMultiHash<int,_QTextFrame_*>::valuesImpl<int>
            ((QList<QTextFrame_*> *)&local_58,&td->childFrameMap,(int *)&local_70);
  if (CONCAT44(local_58._20_4_,local_58._16_4_) != 0) {
    uVar16 = 0;
    do {
      pQVar1 = *(QTextFrame **)(CONCAT44(local_58._12_4_,local_58._8_4_) + uVar16 * 8);
      pQVar12 = QTextFrame::layoutData(pQVar1);
      if (pQVar12 == (QTextFrameLayoutData *)0x0) {
        lVar13 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
        if (lVar13 == 0) {
          pQVar12 = (QTextFrameLayoutData *)operator_new(0x78);
          pQVar12->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
          pQVar12[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&pQVar12[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          pQVar12[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 0x101;
          pQVar12[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        }
        else {
          pQVar12 = (QTextFrameLayoutData *)operator_new(0x160);
          pQVar12[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&pQVar12[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          pQVar12[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 0x101;
          pQVar12[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
          pQVar12[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          memset(pQVar12 + 0x11,0,0xc0);
        }
        QTextFrame::setLayoutData(pQVar1,pQVar12);
      }
      *(undefined1 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 1;
      uVar16 = uVar16 + 1;
    } while (uVar16 < CONCAT44(local_58._20_4_,local_58._16_4_));
  }
  QTextTableCell::begin(&local_90,cell);
  it.b = local_90.b;
  it.e = local_90.e;
  it.f = local_90.f;
  it.cf = local_90.cf;
  it.cb = local_90.cb;
  it._28_4_ = local_90._28_4_;
  layoutFlow(this,it,__return_storage_ptr__,layoutFrom,layoutTo,width);
  if (CONCAT44(local_58._20_4_,local_58._16_4_) != 0) {
    uVar16 = 0;
    iVar9 = 0;
    do {
      pQVar1 = *(QTextFrame **)(CONCAT44(local_58._12_4_,local_58._8_4_) + uVar16 * 8);
      pQVar12 = QTextFrame::layoutData(pQVar1);
      if (pQVar12 == (QTextFrameLayoutData *)0x0) {
        lVar13 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
        if (lVar13 == 0) {
          pQVar12 = (QTextFrameLayoutData *)operator_new(0x78);
          pQVar12->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
          pQVar12[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&pQVar12[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          pQVar12[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 0x101;
          pQVar12[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        }
        else {
          pQVar12 = (QTextFrameLayoutData *)operator_new(0x160);
          pQVar12[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&pQVar12[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          pQVar12[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 0x101;
          pQVar12[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
          pQVar12[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar12[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          memset(pQVar12 + 0x11,0,0xc0);
        }
        QTextFrame::setLayoutData(pQVar1,pQVar12);
      }
      QTextFrame::frameFormat((QTextFrame *)&local_70);
      iVar8 = QTextFormat::intProperty(&local_70,0x800);
      QTextFormat::~QTextFormat(&local_70);
      if (iVar8 != 0) {
        iVar10 = *(int *)((long)&pQVar12[1]._vptr_QTextFrameLayoutData + 4) +
                 *(int *)((long)&pQVar12[2]._vptr_QTextFrameLayoutData + 4);
        iVar8 = (__return_storage_ptr__->y).val;
        if (iVar10 < iVar8) {
          iVar10 = iVar8;
        }
        (__return_storage_ptr__->y).val = iVar10;
      }
      iVar8 = *(int *)((long)&pQVar12[8]._vptr_QTextFrameLayoutData + 4);
      if (iVar8 < iVar9) {
        iVar8 = iVar9;
      }
      uVar16 = uVar16 + 1;
      iVar9 = iVar8;
    } while (uVar16 < CONCAT44(local_58._20_4_,local_58._16_4_));
  }
  iVar9 = (__return_storage_ptr__->minimumWidth).val;
  iVar10 = (__return_storage_ptr__->maximumWidth).val;
  if (iVar10 <= iVar8) {
    iVar10 = iVar8;
  }
  (__return_storage_ptr__->maximumWidth).val = iVar10;
  if (iVar8 < iVar9) {
    iVar8 = iVar9;
  }
  (__return_storage_ptr__->minimumWidth).val = iVar8;
  pQVar12 = QTextFrame::layoutData(&t->super_QTextFrame);
  if (pQVar12 == (QTextFrameLayoutData *)0x0) {
    lVar13 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar13 == 0) {
      pQVar12 = (QTextFrameLayoutData *)operator_new(0x78);
      pQVar12->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
      pQVar12[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&pQVar12[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      pQVar12[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 0x101;
      pQVar12[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
    }
    else {
      pQVar12 = (QTextFrameLayoutData *)operator_new(0x160);
      pQVar12[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&pQVar12[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      pQVar12[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 0x101;
      pQVar12[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
      pQVar12[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar12[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      memset(pQVar12 + 0x11,0,0xc0);
    }
    QTextFrame::setLayoutData(&t->super_QTextFrame,pQVar12);
  }
  QList<QPointer<QTextFrame>_>::clear((QList<QPointer<QTextFrame>_> *)(pQVar12 + 0xc));
  piVar5 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTextLayoutStruct QTextDocumentLayoutPrivate::layoutCell(QTextTable *t, const QTextTableCell &cell, QFixed width,
                                                        int layoutFrom, int layoutTo, QTextTableData *td,
                                                        QFixed absoluteTableY, bool withPageBreaks)
{
    qCDebug(lcTable) << "layoutCell";
    QTextLayoutStruct layoutStruct;
    layoutStruct.frame = t;
    layoutStruct.minimumWidth = 0;
    layoutStruct.maximumWidth = QFIXED_MAX;
    layoutStruct.y = 0;

    const QFixed topPadding = td->topPadding(t, cell);
    if (withPageBreaks) {
        layoutStruct.frameY = absoluteTableY + td->rowPositions.at(cell.row()) + topPadding;
    }
    layoutStruct.x_left = 0;
    layoutStruct.x_right = width;
    // we get called with different widths all the time (for example for figuring
    // out the min/max widths), so we always have to do the full layout ;(
    // also when for example in a table layoutFrom/layoutTo affect only one cell,
    // making that one cell grow the available width of the other cells may change
    // (shrink) and therefore when layoutCell gets called for them they have to
    // be re-laid out, even if layoutFrom/layoutTo is not in their range. Hence
    // this line:

    layoutStruct.pageHeight = QFixed::fromReal(document->pageSize().height());
    if (layoutStruct.pageHeight < 0 || !withPageBreaks)
        layoutStruct.pageHeight = QFIXED_MAX;
    const int currentPage = layoutStruct.currentPage();

    layoutStruct.pageTopMargin = td->effectiveTopMargin
            + td->cellSpacing
            + td->border
            + td->paddingProperty(cell.format(), QTextFormat::TableCellTopPadding); // top cell-border is not repeated

#ifndef QT_NO_CSSPARSER
    const int headerRowCount = t->format().headerRowCount();
    if (td->borderCollapse && headerRowCount > 0) {
        // consider the header row's bottom edge width
        qreal headerRowBottomBorderWidth = axisEdgeData(t, td, t->cellAt(headerRowCount - 1, cell.column()), QCss::BottomEdge).width;
        layoutStruct.pageTopMargin += QFixed::fromReal(scaleToDevice(headerRowBottomBorderWidth) / 2);
    }
#endif

    layoutStruct.pageBottomMargin = td->effectiveBottomMargin + td->cellSpacing + td->effectiveBottomBorder + td->bottomPadding(t, cell);
    layoutStruct.pageBottom = (currentPage + 1) * layoutStruct.pageHeight - layoutStruct.pageBottomMargin;

    layoutStruct.fullLayout = true;

    QFixed pageTop = currentPage * layoutStruct.pageHeight + layoutStruct.pageTopMargin - layoutStruct.frameY;
    layoutStruct.y = qMax(layoutStruct.y, pageTop);

    const QList<QTextFrame *> childFrames = td->childFrameMap.values(cell.row() + cell.column() * t->rows());
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *frame = childFrames.at(i);
        QTextFrameData *cd = data(frame);
        cd->sizeDirty = true;
    }

    layoutFlow(cell.begin(), &layoutStruct, layoutFrom, layoutTo, width);

    QFixed floatMinWidth;

    // floats that are located inside the text (like inline images) aren't taken into account by
    // layoutFlow with regards to the cell height (layoutStruct->y), so for a safety measure we
    // do that here. For example with <td><img align="right" src="..." />blah</td>
    // when the image happens to be higher than the text
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *frame = childFrames.at(i);
        QTextFrameData *cd = data(frame);

        if (frame->frameFormat().position() != QTextFrameFormat::InFlow)
            layoutStruct.y = qMax(layoutStruct.y, cd->position.y + cd->size.height);

        floatMinWidth = qMax(floatMinWidth, cd->minimumWidth);
    }

    // constraint the maximum/minimumWidth by the minimum width of the fixed size floats,
    // to keep them visible
    layoutStruct.maximumWidth = qMax(layoutStruct.maximumWidth, floatMinWidth);
    layoutStruct.minimumWidth = qMax(layoutStruct.minimumWidth, floatMinWidth);

    // as floats in cells get added to the table's float list but must not affect
    // floats in other cells we must clear the list here.
    data(t)->floats.clear();

//    qDebug("layoutCell done");

    return layoutStruct;
}